

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ReductionParameter::InternalSerializeWithCachedSizesToArray
          (ReductionParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 2) != 0) {
    uVar7 = (ulong)this->operation_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 1) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar6 = target + 1;
    *target = 0x10;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 4) != 0) {
    fVar1 = this->coeff_;
    *target = 0x1d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ReductionParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ReductionParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ReductionParameter.ReductionOp operation = 1 [default = SUM];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->operation(), target);
  }

  // optional int32 axis = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->axis(), target);
  }

  // optional float coeff = 3 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->coeff(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ReductionParameter)
  return target;
}